

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeModel::QTreeModel(QTreeModel *this,int columns,QTreeWidget *parent)

{
  long lVar1;
  QAbstractItemModelPrivate *pQVar2;
  QFlags<Qt::ItemFlag> *this_00;
  void *pvVar3;
  QTreeModel *in_RDX;
  QAbstractItemModel *in_RDI;
  long in_FS_OFFSET;
  ItemFlag flags;
  QTreeModelPrivate *in_stack_ffffffffffffffb0;
  QTreeWidgetItem *this_01;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QAbstractItemModelPrivate *)operator_new(0xd8);
  QTreeModelPrivate::QTreeModelPrivate(in_stack_ffffffffffffffb0);
  QAbstractItemModel::QAbstractItemModel(in_RDI,pQVar2,(QObject *)in_RDX);
  flags = (ItemFlag)((ulong)pQVar2 >> 0x20);
  *(undefined ***)in_RDI = &PTR_metaObject_00d314e0;
  this_01 = (QTreeWidgetItem *)0x60;
  this_00 = (QFlags<Qt::ItemFlag> *)operator_new(0x60);
  QTreeWidgetItem::QTreeWidgetItem(this_01,(int)((ulong)this_00 >> 0x20));
  *(QFlags<Qt::ItemFlag> **)(in_RDI + 0x10) = this_00;
  pvVar3 = operator_new((ulong)this_01);
  QTreeWidgetItem::QTreeWidgetItem(this_01,(int)((ulong)this_00 >> 0x20));
  *(void **)(in_RDI + 0x18) = pvVar3;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x90e248);
  QList<QTreeWidgetItemIterator_*>::QList((QList<QTreeWidgetItemIterator_*> *)0x90e256);
  QBasicTimer::QBasicTimer((QBasicTimer *)(in_RDI + 0x50));
  in_RDI[0x54] = (QAbstractItemModel)0x0;
  *(QTreeModel **)(*(long *)(in_RDI + 0x10) + 0x28) = in_RDX;
  QFlags<Qt::ItemFlag>::QFlags(this_00,flags);
  *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x58) = local_c;
  *(QTreeModel **)(*(long *)(in_RDI + 0x18) + 0x28) = in_RDX;
  setColumnCount(in_RDX,(int)((ulong)in_RDI >> 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeModel::QTreeModel(int columns, QTreeWidget *parent)
    : QAbstractItemModel(*new QTreeModelPrivate, parent),
      rootItem(new QTreeWidgetItem),
      headerItem(new QTreeWidgetItem)
{
    rootItem->view = parent;
    rootItem->itemFlags = Qt::ItemIsDropEnabled;
    headerItem->view = parent;
    setColumnCount(columns);
}